

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx::
     BVHNIntersectorKHybrid<4,_8,_257,_true,_embree::avx::VirtualCurveIntersectorK<8>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray,
              TravRayK<8,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  bool bVar8;
  long lVar9;
  char cVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong *puVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  vint4 ai;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  vint4 ai_3;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  vint4 ai_1;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  vint4 bi_1;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  vint4 bi_3;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  vint4 bi;
  undefined1 auVar40 [16];
  float fVar41;
  float fVar43;
  float fVar44;
  undefined1 auVar42 [16];
  float fVar45;
  float fVar46;
  float fVar50;
  float fVar51;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar52;
  float fVar53;
  float fVar57;
  float fVar58;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  NodeRef stack [244];
  size_t local_7d8;
  ulong local_7d0 [244];
  
  puVar14 = local_7d0;
  local_7d8 = root.ptr;
  fVar1 = *(float *)((long)&(tray->org).field_0 + k * 4);
  auVar63._4_4_ = fVar1;
  auVar63._0_4_ = fVar1;
  auVar63._8_4_ = fVar1;
  auVar63._12_4_ = fVar1;
  fVar2 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar64._4_4_ = fVar2;
  auVar64._0_4_ = fVar2;
  auVar64._8_4_ = fVar2;
  auVar64._12_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar60._4_4_ = fVar3;
  auVar60._0_4_ = fVar3;
  auVar60._8_4_ = fVar3;
  auVar60._12_4_ = fVar3;
  fVar4 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fVar5 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar6 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x40);
  fVar41 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar43 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar44 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar37 = ZEXT416((uint)(fVar41 * 0.99999964));
  auVar37 = vshufps_avx(auVar37,auVar37,0);
  auVar38 = ZEXT416((uint)(fVar43 * 0.99999964));
  auVar38 = vshufps_avx(auVar38,auVar38,0);
  auVar33 = ZEXT416((uint)(fVar44 * 0.99999964));
  auVar33 = vshufps_avx(auVar33,auVar33,0);
  auVar19 = ZEXT416((uint)(fVar41 * 1.0000004));
  auVar19 = vshufps_avx(auVar19,auVar19,0);
  auVar20 = ZEXT416((uint)(fVar43 * 1.0000004));
  auVar20 = vshufps_avx(auVar20,auVar20,0);
  auVar21 = ZEXT416((uint)(fVar44 * 1.0000004));
  auVar21 = vshufps_avx(auVar21,auVar21,0);
  uVar18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar13 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar7 = (tray->tnear).field_0.i[k];
  auVar47._4_4_ = iVar7;
  auVar47._0_4_ = iVar7;
  auVar47._8_4_ = iVar7;
  auVar47._12_4_ = iVar7;
  iVar7 = (tray->tfar).field_0.i[k];
  auVar54._4_4_ = iVar7;
  auVar54._0_4_ = iVar7;
  auVar54._8_4_ = iVar7;
  auVar54._12_4_ = iVar7;
LAB_003b070a:
  bVar8 = puVar14 != &local_7d8;
  if (puVar14 == &local_7d8) {
    return bVar8;
  }
  uVar15 = puVar14[-1];
  puVar14 = puVar14 + -1;
LAB_003b071e:
  if ((uVar15 & 0xf) == 0) {
    auVar23 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x20 + uVar18),auVar63);
    auVar22._0_4_ = auVar37._0_4_ * auVar23._0_4_;
    auVar22._4_4_ = auVar37._4_4_ * auVar23._4_4_;
    auVar22._8_4_ = auVar37._8_4_ * auVar23._8_4_;
    auVar22._12_4_ = auVar37._12_4_ * auVar23._12_4_;
    auVar23 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x20 + uVar13),auVar64);
    auVar27._0_4_ = auVar38._0_4_ * auVar23._0_4_;
    auVar27._4_4_ = auVar38._4_4_ * auVar23._4_4_;
    auVar27._8_4_ = auVar38._8_4_ * auVar23._8_4_;
    auVar27._12_4_ = auVar38._12_4_ * auVar23._12_4_;
    auVar23 = vmaxps_avx(auVar22,auVar27);
    auVar55 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x20 + uVar17),auVar60);
    auVar28._0_4_ = auVar33._0_4_ * auVar55._0_4_;
    auVar28._4_4_ = auVar33._4_4_ * auVar55._4_4_;
    auVar28._8_4_ = auVar33._8_4_ * auVar55._8_4_;
    auVar28._12_4_ = auVar33._12_4_ * auVar55._12_4_;
    auVar55 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x20 + (uVar18 ^ 0x10)),auVar63);
    auVar31._0_4_ = auVar19._0_4_ * auVar55._0_4_;
    auVar31._4_4_ = auVar19._4_4_ * auVar55._4_4_;
    auVar31._8_4_ = auVar19._8_4_ * auVar55._8_4_;
    auVar31._12_4_ = auVar19._12_4_ * auVar55._12_4_;
    auVar55 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x20 + (uVar13 ^ 0x10)),auVar64);
    auVar34._0_4_ = auVar20._0_4_ * auVar55._0_4_;
    auVar34._4_4_ = auVar20._4_4_ * auVar55._4_4_;
    auVar34._8_4_ = auVar20._8_4_ * auVar55._8_4_;
    auVar34._12_4_ = auVar20._12_4_ * auVar55._12_4_;
    auVar26 = vminps_avx(auVar31,auVar34);
    auVar55 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x20 + (uVar17 ^ 0x10)),auVar60);
    auVar35._0_4_ = auVar21._0_4_ * auVar55._0_4_;
    auVar35._4_4_ = auVar21._4_4_ * auVar55._4_4_;
    auVar35._8_4_ = auVar21._8_4_ * auVar55._8_4_;
    auVar35._12_4_ = auVar21._12_4_ * auVar55._12_4_;
    auVar55 = vmaxps_avx(auVar28,auVar47);
    auVar23 = vmaxps_avx(auVar23,auVar55);
    auVar55 = vminps_avx(auVar35,auVar54);
    auVar55 = vminps_avx(auVar26,auVar55);
    auVar23 = vcmpps_avx(auVar23,auVar55,2);
  }
  else {
    if ((int)(uVar15 & 0xf) != 2) {
      cVar10 = (**(code **)((long)This->leafIntersector +
                           (ulong)*(byte *)(uVar15 & 0xfffffffffffffff0) * 0x40 + 0x28))
                         (pre,ray,k,context);
      if (cVar10 != '\0') {
        *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
        return bVar8;
      }
      goto LAB_003b070a;
    }
    uVar16 = uVar15 & 0xfffffffffffffff0;
    auVar55._0_4_ =
         fVar6 * *(float *)(uVar16 + 0x80) + fVar5 * *(float *)(uVar16 + 0x50) +
         fVar4 * *(float *)(uVar16 + 0x20);
    auVar55._4_4_ =
         fVar6 * *(float *)(uVar16 + 0x84) + fVar5 * *(float *)(uVar16 + 0x54) +
         fVar4 * *(float *)(uVar16 + 0x24);
    auVar55._8_4_ =
         fVar6 * *(float *)(uVar16 + 0x88) + fVar5 * *(float *)(uVar16 + 0x58) +
         fVar4 * *(float *)(uVar16 + 0x28);
    auVar55._12_4_ =
         fVar6 * *(float *)(uVar16 + 0x8c) + fVar5 * *(float *)(uVar16 + 0x5c) +
         fVar4 * *(float *)(uVar16 + 0x2c);
    auVar42._0_4_ =
         fVar6 * *(float *)(uVar16 + 0x90) + fVar5 * *(float *)(uVar16 + 0x60) +
         fVar4 * *(float *)(uVar16 + 0x30);
    auVar42._4_4_ =
         fVar6 * *(float *)(uVar16 + 0x94) + fVar5 * *(float *)(uVar16 + 100) +
         fVar4 * *(float *)(uVar16 + 0x34);
    auVar42._8_4_ =
         fVar6 * *(float *)(uVar16 + 0x98) + fVar5 * *(float *)(uVar16 + 0x68) +
         fVar4 * *(float *)(uVar16 + 0x38);
    auVar42._12_4_ =
         fVar6 * *(float *)(uVar16 + 0x9c) + fVar5 * *(float *)(uVar16 + 0x6c) +
         fVar4 * *(float *)(uVar16 + 0x3c);
    auVar48._0_4_ =
         fVar6 * *(float *)(uVar16 + 0xa0) + fVar5 * *(float *)(uVar16 + 0x70) +
         fVar4 * *(float *)(uVar16 + 0x40);
    auVar48._4_4_ =
         fVar6 * *(float *)(uVar16 + 0xa4) + fVar5 * *(float *)(uVar16 + 0x74) +
         fVar4 * *(float *)(uVar16 + 0x44);
    auVar48._8_4_ =
         fVar6 * *(float *)(uVar16 + 0xa8) + fVar5 * *(float *)(uVar16 + 0x78) +
         fVar4 * *(float *)(uVar16 + 0x48);
    auVar48._12_4_ =
         fVar6 * *(float *)(uVar16 + 0xac) + fVar5 * *(float *)(uVar16 + 0x7c) +
         fVar4 * *(float *)(uVar16 + 0x4c);
    auVar62._8_4_ = 0x7fffffff;
    auVar62._0_8_ = 0x7fffffff7fffffff;
    auVar62._12_4_ = 0x7fffffff;
    auVar23 = vandps_avx(auVar55,auVar62);
    auVar24._8_4_ = 0x219392ef;
    auVar24._0_8_ = 0x219392ef219392ef;
    auVar24._12_4_ = 0x219392ef;
    auVar23 = vcmpps_avx(auVar23,auVar24,1);
    auVar55 = vblendvps_avx(auVar55,auVar24,auVar23);
    auVar23 = vandps_avx(auVar42,auVar62);
    auVar23 = vcmpps_avx(auVar23,auVar24,1);
    auVar26 = vblendvps_avx(auVar42,auVar24,auVar23);
    auVar23 = vandps_avx(auVar48,auVar62);
    auVar23 = vcmpps_avx(auVar23,auVar24,1);
    auVar23 = vblendvps_avx(auVar48,auVar24,auVar23);
    auVar24 = vrcpps_avx(auVar55);
    fVar41 = auVar24._0_4_;
    auVar49._0_4_ = fVar41 * auVar55._0_4_;
    fVar43 = auVar24._4_4_;
    auVar49._4_4_ = fVar43 * auVar55._4_4_;
    fVar44 = auVar24._8_4_;
    auVar49._8_4_ = fVar44 * auVar55._8_4_;
    fVar45 = auVar24._12_4_;
    auVar49._12_4_ = fVar45 * auVar55._12_4_;
    auVar25._8_4_ = 0x3f800000;
    auVar25._0_8_ = 0x3f8000003f800000;
    auVar25._12_4_ = 0x3f800000;
    auVar55 = vsubps_avx(auVar25,auVar49);
    fVar41 = fVar41 + fVar41 * auVar55._0_4_;
    fVar43 = fVar43 + fVar43 * auVar55._4_4_;
    fVar44 = fVar44 + fVar44 * auVar55._8_4_;
    fVar45 = fVar45 + fVar45 * auVar55._12_4_;
    auVar55 = vrcpps_avx(auVar26);
    fVar46 = auVar55._0_4_;
    auVar56._0_4_ = fVar46 * auVar26._0_4_;
    fVar50 = auVar55._4_4_;
    auVar56._4_4_ = fVar50 * auVar26._4_4_;
    fVar51 = auVar55._8_4_;
    auVar56._8_4_ = fVar51 * auVar26._8_4_;
    fVar52 = auVar55._12_4_;
    auVar56._12_4_ = fVar52 * auVar26._12_4_;
    auVar55 = vsubps_avx(auVar25,auVar56);
    fVar46 = fVar46 + fVar46 * auVar55._0_4_;
    fVar50 = fVar50 + fVar50 * auVar55._4_4_;
    fVar51 = fVar51 + fVar51 * auVar55._8_4_;
    fVar52 = fVar52 + fVar52 * auVar55._12_4_;
    auVar55 = vrcpps_avx(auVar23);
    fVar53 = auVar55._0_4_;
    auVar61._0_4_ = fVar53 * auVar23._0_4_;
    fVar57 = auVar55._4_4_;
    auVar61._4_4_ = fVar57 * auVar23._4_4_;
    fVar58 = auVar55._8_4_;
    auVar61._8_4_ = fVar58 * auVar23._8_4_;
    fVar59 = auVar55._12_4_;
    auVar61._12_4_ = fVar59 * auVar23._12_4_;
    auVar23 = vsubps_avx(auVar25,auVar61);
    fVar53 = fVar53 + fVar53 * auVar23._0_4_;
    fVar57 = fVar57 + fVar57 * auVar23._4_4_;
    fVar58 = fVar58 + fVar58 * auVar23._8_4_;
    fVar59 = fVar59 + fVar59 * auVar23._12_4_;
    auVar32._0_4_ =
         (fVar1 * *(float *)(uVar16 + 0x20) +
         fVar2 * *(float *)(uVar16 + 0x50) +
         fVar3 * *(float *)(uVar16 + 0x80) + *(float *)(uVar16 + 0xb0)) * -fVar41;
    auVar32._4_4_ =
         (fVar1 * *(float *)(uVar16 + 0x24) +
         fVar2 * *(float *)(uVar16 + 0x54) +
         fVar3 * *(float *)(uVar16 + 0x84) + *(float *)(uVar16 + 0xb4)) * -fVar43;
    auVar32._8_4_ =
         (fVar1 * *(float *)(uVar16 + 0x28) +
         fVar2 * *(float *)(uVar16 + 0x58) +
         fVar3 * *(float *)(uVar16 + 0x88) + *(float *)(uVar16 + 0xb8)) * -fVar44;
    auVar32._12_4_ =
         (fVar1 * *(float *)(uVar16 + 0x2c) +
         fVar2 * *(float *)(uVar16 + 0x5c) +
         fVar3 * *(float *)(uVar16 + 0x8c) + *(float *)(uVar16 + 0xbc)) * -fVar45;
    auVar29._0_4_ =
         (fVar1 * *(float *)(uVar16 + 0x30) +
         fVar2 * *(float *)(uVar16 + 0x60) +
         fVar3 * *(float *)(uVar16 + 0x90) + *(float *)(uVar16 + 0xc0)) * -fVar46;
    auVar29._4_4_ =
         (fVar1 * *(float *)(uVar16 + 0x34) +
         fVar2 * *(float *)(uVar16 + 100) +
         fVar3 * *(float *)(uVar16 + 0x94) + *(float *)(uVar16 + 0xc4)) * -fVar50;
    auVar29._8_4_ =
         (fVar1 * *(float *)(uVar16 + 0x38) +
         fVar2 * *(float *)(uVar16 + 0x68) +
         fVar3 * *(float *)(uVar16 + 0x98) + *(float *)(uVar16 + 200)) * -fVar51;
    auVar29._12_4_ =
         (fVar1 * *(float *)(uVar16 + 0x3c) +
         fVar2 * *(float *)(uVar16 + 0x6c) +
         fVar3 * *(float *)(uVar16 + 0x9c) + *(float *)(uVar16 + 0xcc)) * -fVar52;
    auVar26._0_4_ =
         (fVar1 * *(float *)(uVar16 + 0x40) +
         fVar2 * *(float *)(uVar16 + 0x70) +
         fVar3 * *(float *)(uVar16 + 0xa0) + *(float *)(uVar16 + 0xd0)) * -fVar53;
    auVar26._4_4_ =
         (fVar1 * *(float *)(uVar16 + 0x44) +
         fVar2 * *(float *)(uVar16 + 0x74) +
         fVar3 * *(float *)(uVar16 + 0xa4) + *(float *)(uVar16 + 0xd4)) * -fVar57;
    auVar26._8_4_ =
         (fVar1 * *(float *)(uVar16 + 0x48) +
         fVar2 * *(float *)(uVar16 + 0x78) +
         fVar3 * *(float *)(uVar16 + 0xa8) + *(float *)(uVar16 + 0xd8)) * -fVar58;
    auVar26._12_4_ =
         (fVar1 * *(float *)(uVar16 + 0x4c) +
         fVar2 * *(float *)(uVar16 + 0x7c) +
         fVar3 * *(float *)(uVar16 + 0xac) + *(float *)(uVar16 + 0xdc)) * -fVar59;
    auVar36._0_4_ = fVar41 + auVar32._0_4_;
    auVar36._4_4_ = fVar43 + auVar32._4_4_;
    auVar36._8_4_ = fVar44 + auVar32._8_4_;
    auVar36._12_4_ = fVar45 + auVar32._12_4_;
    auVar39._0_4_ = fVar46 + auVar29._0_4_;
    auVar39._4_4_ = fVar50 + auVar29._4_4_;
    auVar39._8_4_ = fVar51 + auVar29._8_4_;
    auVar39._12_4_ = fVar52 + auVar29._12_4_;
    auVar40._0_4_ = fVar53 + auVar26._0_4_;
    auVar40._4_4_ = fVar57 + auVar26._4_4_;
    auVar40._8_4_ = fVar58 + auVar26._8_4_;
    auVar40._12_4_ = fVar59 + auVar26._12_4_;
    auVar23 = vpminsd_avx(auVar29,auVar39);
    auVar55 = vpminsd_avx(auVar26,auVar40);
    auVar23 = vmaxps_avx(auVar23,auVar55);
    auVar25 = vpminsd_avx(auVar32,auVar36);
    auVar24 = vpmaxsd_avx(auVar32,auVar36);
    auVar55 = vpmaxsd_avx(auVar29,auVar39);
    auVar26 = vpmaxsd_avx(auVar26,auVar40);
    auVar26 = vminps_avx(auVar55,auVar26);
    auVar55 = vmaxps_avx(auVar47,auVar25);
    auVar23 = vmaxps_avx(auVar55,auVar23);
    auVar55 = vminps_avx(auVar54,auVar24);
    auVar55 = vminps_avx(auVar55,auVar26);
    auVar30._0_4_ = auVar23._0_4_ * 0.99999964;
    auVar30._4_4_ = auVar23._4_4_ * 0.99999964;
    auVar30._8_4_ = auVar23._8_4_ * 0.99999964;
    auVar30._12_4_ = auVar23._12_4_ * 0.99999964;
    auVar23._0_4_ = auVar55._0_4_ * 1.0000004;
    auVar23._4_4_ = auVar55._4_4_ * 1.0000004;
    auVar23._8_4_ = auVar55._8_4_ * 1.0000004;
    auVar23._12_4_ = auVar55._12_4_ * 1.0000004;
    auVar23 = vcmpps_avx(auVar30,auVar23,2);
  }
  auVar23 = vpslld_avx(auVar23,0x1f);
  uVar11 = vmovmskps_avx(auVar23);
  if (uVar11 == 0) goto LAB_003b070a;
  uVar11 = uVar11 & 0xff;
  uVar16 = uVar15 & 0xfffffffffffffff0;
  lVar9 = 0;
  if (uVar11 != 0) {
    for (; (uVar11 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
    }
  }
  uVar15 = *(ulong *)(uVar16 + lVar9 * 8);
  uVar11 = uVar11 - 1 & uVar11;
  if (uVar11 != 0) {
    *puVar14 = uVar15;
    puVar14 = puVar14 + 1;
    lVar9 = 0;
    if (uVar11 != 0) {
      for (; (uVar11 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
      }
    }
    uVar15 = *(ulong *)(uVar16 + lVar9 * 8);
    uVar11 = uVar11 - 1 & uVar11;
    uVar12 = (ulong)uVar11;
    if (uVar11 != 0) {
      do {
        *puVar14 = uVar15;
        puVar14 = puVar14 + 1;
        lVar9 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
          }
        }
        uVar15 = *(ulong *)(uVar16 + lVar9 * 8);
        uVar12 = uVar12 & uVar12 - 1;
      } while (uVar12 != 0);
    }
  }
  goto LAB_003b071e;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }